

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O1

int QRsol(int n,realtype **h,realtype *q,realtype *b)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  realtype rVar10;
  
  if (0 < n) {
    rVar10 = *b;
    lVar9 = 0;
    do {
      dVar2 = *(double *)((long)q + lVar9 * 2);
      dVar3 = *(double *)((long)q + lVar9 * 2 + 8);
      dVar4 = *(double *)((long)b + lVar9 + 8);
      *(double *)((long)b + lVar9) = dVar2 * rVar10 - dVar4 * dVar3;
      rVar10 = dVar3 * rVar10 + dVar2 * dVar4;
      *(realtype *)((long)b + lVar9 + 8) = rVar10;
      lVar9 = lVar9 + 8;
    } while ((ulong)(uint)n * 8 - lVar9 != 0);
  }
  if (0 < n) {
    uVar8 = (ulong)(n - 1);
    uVar6 = (ulong)(uint)n;
    do {
      dVar2 = h[uVar6 - 1][uVar6 - 1];
      if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_00103edd;
      uVar1 = uVar6 - 1;
      b[uVar1] = b[uVar1] / dVar2;
      if (1 < (long)uVar6) {
        uVar7 = 0;
        do {
          b[uVar7] = b[uVar7] - b[uVar1] * h[uVar7][uVar1];
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      uVar8 = uVar8 - 1;
      bVar5 = 1 < (long)uVar6;
      uVar6 = uVar1;
    } while (bVar5);
  }
  uVar6 = 0;
LAB_00103edd:
  return (int)uVar6;
}

Assistant:

int QRsol(int n, realtype **h, realtype *q, realtype *b)
{
  realtype c, s, temp1, temp2;
  int i, k, q_ptr, code=0;

  /* Compute Q*b */
  
  for (k=0; k < n; k++) {
    q_ptr = 2*k;
    c = q[q_ptr];
    s = q[q_ptr+1];
    temp1 = b[k];
    temp2 = b[k+1];
    b[k] = c*temp1 - s*temp2;
    b[k+1] = s*temp1 + c*temp2;
  }

  /* Solve  R*x = Q*b */

  for (k=n-1; k >= 0; k--) {
    if (h[k][k] == ZERO) {
      code = k + 1;
      break;
    }
    b[k] /= h[k][k];
    for (i=0; i < k; i++) b[i] -= b[k]*h[i][k];
  }
  
  return (code);
}